

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

void __thiscall pstore::database::~database(database *this)

{
  int in_ESI;
  
  this->_vptr_database = (_func_int **)&PTR__database_0012df48;
  close(this,in_ESI);
  std::__cxx11::string::~string((string *)&this->sync_name_);
  std::array<std::shared_ptr<pstore::index::index_base>,_6UL>::~array(&this->indices_);
  std::unique_lock<pstore::file::range_lock>::~unique_lock(&this->lock_);
  pstore::file::range_lock::~range_lock(&this->range_lock_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->header_).super___shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  storage::~storage(&this->storage_);
  return;
}

Assistant:

database::~database () noexcept {
        no_ex_escape ([this] () { this->close (); });
    }